

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

void mu_end_window(mu_Context *ctx)

{
  mu_Context *ctx_local;
  
  mu_pop_clip_rect(ctx);
  end_root_container(ctx);
  return;
}

Assistant:

void mu_end_window(mu_Context *ctx) {
  mu_pop_clip_rect(ctx);
  end_root_container(ctx);
}